

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

iterator __thiscall
QHash<QString,bool>::emplace<bool_const&>(QHash<QString,bool> *this,QString *key,bool *args)

{
  long in_FS_OFFSET;
  piter pVar1;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (key->d).d;
  local_38.ptr = (key->d).ptr;
  local_38.size = (key->d).size;
  if (local_38.d != (Data *)0x0) {
    LOCK();
    ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pVar1 = (piter)emplace<bool_const&>(this,(QString *)&local_38,args);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }